

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *o,Vector<double,_3U> *v)

{
  long lVar1;
  long lVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"[ ",2);
  std::ostream::_M_insert<double>(v->data_[0]);
  lVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    lVar1 = lVar2 + 1;
    lVar2 = lVar2 + 1;
    std::ostream::_M_insert<double>(v->data_[lVar1]);
  } while (lVar2 != 2);
  std::__ostream_insert<char,std::char_traits<char>>(o," ]",2);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const Vector<Real, Dim>& v) {
    o << "[ ";

    for (unsigned int i = 0; i < Dim; i++) {
      o << v[i];

      if (i != Dim - 1) { o << ", "; }
    }

    o << " ]";
    return o;
  }